

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_util.c
# Opt level: O0

int dwarf_get_address_size(Dwarf_Debug dbg,Dwarf_Half *ret_addr_size,Dwarf_Error *error)

{
  Dwarf_Half address_size;
  Dwarf_Error *error_local;
  Dwarf_Half *ret_addr_size_local;
  Dwarf_Debug dbg_local;
  
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_get_address_size()either null or it containsa stale Dwarf_Debug pointer"
                       );
    dbg_local._4_4_ = 1;
  }
  else {
    *ret_addr_size = (ushort)dbg->de_pointer_size;
    dbg_local._4_4_ = 0;
  }
  return dbg_local._4_4_;
}

Assistant:

int
_dwarf_get_address_size(Dwarf_Debug dbg, Dwarf_Die die)
{
    Dwarf_CU_Context context = 0;
    Dwarf_Half addrsize = 0;
    if (!die) {
        return dbg->de_pointer_size;
    }
    context = die->di_cu_context;
    addrsize = context->cc_address_size;
    return addrsize;
}